

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMAttrMapImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMAttrMapImpl::setNamedItemFast(DOMAttrMapImpl *this,DOMNode *arg)

{
  int iVar1;
  DOMNodeImpl *this_00;
  undefined4 extraout_var;
  int i;
  DOMNodeImpl *argImpl;
  DOMNode *arg_local;
  DOMAttrMapImpl *this_local;
  
  this_00 = xercesc_4_0::castToNodeImpl(arg);
  this_00->fOwnerNode = this->fOwnerNode;
  DOMNodeImpl::isOwned(this_00,true);
  iVar1 = (*arg->_vptr_DOMNode[2])();
  iVar1 = (*(this->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[0xe])
                    (this,CONCAT44(extraout_var,iVar1));
  if (iVar1 < 0) {
    DOMNodeVector::insertElementAt(this->fNodes,arg,(long)(-1 - iVar1));
  }
  else {
    DOMNodeVector::setElementAt(this->fNodes,arg,(long)iVar1);
  }
  return;
}

Assistant:

void DOMAttrMapImpl::setNamedItemFast(DOMNode *arg)
{
    DOMNodeImpl *argImpl = castToNodeImpl(arg);

    argImpl->fOwnerNode = fOwnerNode;
    argImpl->isOwned(true);
    int i = findNamePoint(arg->getNodeName());

    if(i >= 0)
      fNodes->setElementAt(arg, i);
    else
    {
      i= -1 -i;
      fNodes->insertElementAt(arg, i);
    }
}